

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

void us_internal_loop_post(us_loop_t *loop)

{
  us_internal_free_closed_sockets(loop);
  (*(loop->data).post_cb)(loop);
  return;
}

Assistant:

void us_internal_loop_post(struct us_loop_t *loop) {
    us_internal_free_closed_sockets(loop);
    loop->data.post_cb(loop);
}